

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GraphElements.h
# Opt level: O2

DFSIt<dg::vr::VRCodeGraph::SimpleVisit> * __thiscall
dg::vr::VRCodeGraph::DFSIt<dg::vr::VRCodeGraph::SimpleVisit>::operator++
          (DFSIt<dg::vr::VRCodeGraph::SimpleVisit> *this)

{
  pointer ptVar1;
  VRLocation *pVVar2;
  pointer ppVVar3;
  pointer ppVVar4;
  vector<dg::vr::VREdge_*,_std::allocator<dg::vr::VREdge_*>_> *pvVar5;
  vector<dg::vr::VREdge_*,_std::allocator<dg::vr::VREdge_*>_> *pvVar6;
  bool bVar7;
  pointer puVar8;
  long lVar9;
  ulong uVar10;
  VREdge *nextEdge;
  VREdge *prevEdge;
  VRLocation *current;
  int local_3c;
  VRLocation *next;
  
  do {
    ptVar1 = (this->stack).
             super__Vector_base<std::tuple<dg::vr::VRLocation_*,_unsigned_int,_dg::vr::VREdge_*>,_std::allocator<std::tuple<dg::vr::VRLocation_*,_unsigned_int,_dg::vr::VREdge_*>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if ((this->stack).
        super__Vector_base<std::tuple<dg::vr::VRLocation_*,_unsigned_int,_dg::vr::VREdge_*>,_std::allocator<std::tuple<dg::vr::VRLocation_*,_unsigned_int,_dg::vr::VREdge_*>_>_>
        ._M_impl.super__Vector_impl_data._M_start == ptVar1) {
      return this;
    }
    pVVar2 = ptVar1[-1].super__Tuple_impl<0UL,_dg::vr::VRLocation_*,_unsigned_int,_dg::vr::VREdge_*>
             .super__Head_base<0UL,_dg::vr::VRLocation_*,_false>._M_head_impl;
    uVar10 = (ulong)ptVar1[-1].
                    super__Tuple_impl<0UL,_dg::vr::VRLocation_*,_unsigned_int,_dg::vr::VREdge_*>.
                    super__Tuple_impl<1UL,_unsigned_int,_dg::vr::VREdge_*>.
                    super__Head_base<1UL,_unsigned_int,_false>._M_head_impl;
    prevEdge = ptVar1[-1].
               super__Tuple_impl<0UL,_dg::vr::VRLocation_*,_unsigned_int,_dg::vr::VREdge_*>.
               super__Tuple_impl<1UL,_unsigned_int,_dg::vr::VREdge_*>.
               super__Tuple_impl<2UL,_dg::vr::VREdge_*>.
               super__Head_base<2UL,_dg::vr::VREdge_*,_false>._M_head_impl;
    (this->stack).
    super__Vector_base<std::tuple<dg::vr::VRLocation_*,_unsigned_int,_dg::vr::VREdge_*>,_std::allocator<std::tuple<dg::vr::VRLocation_*,_unsigned_int,_dg::vr::VREdge_*>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = ptVar1 + -1;
    pvVar5 = (vector<dg::vr::VREdge_*,_std::allocator<dg::vr::VREdge_*>_> *)&pVVar2->successors;
    pvVar6 = (vector<dg::vr::VREdge_*,_std::allocator<dg::vr::VREdge_*>_> *)&pVVar2->successors;
    if (this->dir != FORWARD) {
      pvVar5 = &pVVar2->predecessors;
      pvVar6 = &pVVar2->predecessors;
    }
    ppVVar3 = (pvVar6->super__Vector_base<dg::vr::VREdge_*,_std::allocator<dg::vr::VREdge_*>_>).
              _M_impl.super__Vector_impl_data._M_finish;
    ppVVar4 = (pvVar5->super__Vector_base<dg::vr::VREdge_*,_std::allocator<dg::vr::VREdge_*>_>).
              _M_impl.super__Vector_impl_data._M_start;
    lVar9 = uVar10 * 8;
    current = pVVar2;
    for (; uVar10 < ((ulong)((long)ppVVar3 - (long)ppVVar4) >> 3 & 0xffffffff); uVar10 = uVar10 + 1)
    {
      if (this->dir == FORWARD) {
        puVar8 = (pVVar2->successors).
                 super__Vector_base<std::unique_ptr<dg::vr::VREdge,_std::default_delete<dg::vr::VREdge>_>,_std::allocator<std::unique_ptr<dg::vr::VREdge,_std::default_delete<dg::vr::VREdge>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start + uVar10;
      }
      else {
        puVar8 = (pointer)((long)(pVVar2->predecessors).
                                 super__Vector_base<dg::vr::VREdge_*,_std::allocator<dg::vr::VREdge_*>_>
                                 ._M_impl.super__Vector_impl_data._M_start + lVar9);
      }
      bVar7 = isIrrelevant(this,(VREdge *)
                                (puVar8->_M_t).
                                super___uniq_ptr_impl<dg::vr::VREdge,_std::default_delete<dg::vr::VREdge>_>
                                ._M_t);
      if (!bVar7) {
        nextEdge = (VREdge *)CONCAT44(nextEdge._4_4_,(int)uVar10 + 1);
        std::
        vector<std::tuple<dg::vr::VRLocation*,unsigned_int,dg::vr::VREdge*>,std::allocator<std::tuple<dg::vr::VRLocation*,unsigned_int,dg::vr::VREdge*>>>
        ::emplace_back<dg::vr::VRLocation*&,unsigned_int,dg::vr::VREdge*&>
                  ((vector<std::tuple<dg::vr::VRLocation*,unsigned_int,dg::vr::VREdge*>,std::allocator<std::tuple<dg::vr::VRLocation*,unsigned_int,dg::vr::VREdge*>>>
                    *)&this->stack,&current,(uint *)&nextEdge,&prevEdge);
        if (this->dir == FORWARD) {
          puVar8 = (current->successors).
                   super__Vector_base<std::unique_ptr<dg::vr::VREdge,_std::default_delete<dg::vr::VREdge>_>,_std::allocator<std::unique_ptr<dg::vr::VREdge,_std::default_delete<dg::vr::VREdge>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          lVar9 = 8;
        }
        else {
          puVar8 = (pointer)(current->predecessors).
                            super__Vector_base<dg::vr::VREdge_*,_std::allocator<dg::vr::VREdge_*>_>.
                            _M_impl.super__Vector_impl_data._M_start;
          lVar9 = 0;
        }
        nextEdge = *(VREdge **)
                    &puVar8[uVar10 & 0xffffffff]._M_t.
                     super___uniq_ptr_impl<dg::vr::VREdge,_std::default_delete<dg::vr::VREdge>_>.
                     _M_t;
        next = *(VRLocation **)((long)nextEdge + lVar9);
        SimpleVisit::find(&this->super_SimpleVisit,next);
        local_3c = 0;
        std::
        vector<std::tuple<dg::vr::VRLocation*,unsigned_int,dg::vr::VREdge*>,std::allocator<std::tuple<dg::vr::VRLocation*,unsigned_int,dg::vr::VREdge*>>>
        ::emplace_back<dg::vr::VRLocation*&,int,dg::vr::VREdge*&>
                  ((vector<std::tuple<dg::vr::VRLocation*,unsigned_int,dg::vr::VREdge*>,std::allocator<std::tuple<dg::vr::VRLocation*,unsigned_int,dg::vr::VREdge*>>>
                    *)&this->stack,&next,&local_3c,&nextEdge);
        return this;
      }
      lVar9 = lVar9 + 8;
    }
  } while( true );
}

Assistant:

DFSIt &operator++() {
            while (!stack.empty()) {
                VRLocation *current;
                unsigned index;
                VREdge *prevEdge;
                std::tie(current, index, prevEdge) = stack.back();
                stack.pop_back();

                unsigned nextSize = dir == Dir::FORWARD ? current->succsSize()
                                                        : current->predsSize();
                // do not explore if there is no target or if target was already
                // explored or if is in other function

                while (index < nextSize &&
                       isIrrelevant(getNextEdge(current, index)))
                    ++index;

                if (index >= nextSize)
                    continue;
                stack.emplace_back(current, index + 1, prevEdge);

                VREdge *nextEdge = getNextEdge(current, index);
                VRLocation *next = getNextLocation(nextEdge);

                Visit::find(next);
                if (Visit::shouldVisit(next)) {
                    stack.emplace_back(next, 0, nextEdge);
                    break;
                }
            }
            return *this;
        }